

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

int mem_has_null(void *block,uint size)

{
  long lVar1;
  
  if (size != 0) {
    lVar1 = 0;
    do {
      if (*(char *)((long)block + lVar1) == '\0') {
        return 1;
      }
      lVar1 = lVar1 + 1;
    } while (size != (uint)lVar1);
  }
  return 0;
}

Assistant:

int mem_has_null(const void *block, unsigned size)
{
	const unsigned char *bytes = block;
	unsigned i;        
	for(i = 0; i < size; i++)
	{
		if(bytes[i] == 0)
		{
			return 1;
		}
	}
	return 0;
}